

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

uint32_t __thiscall
VmaBlockMetadata_TLSF::GetListIndex
          (VmaBlockMetadata_TLSF *this,uint8_t memoryClass,uint16_t secondIndex)

{
  bool bVar1;
  int iVar2;
  ushort in_DX;
  byte in_SIL;
  VmaBlockMetadata *in_RDI;
  uint32_t index;
  undefined4 local_4;
  
  if (in_SIL == 0) {
    local_4 = (uint)in_DX;
  }
  else {
    iVar2 = (in_SIL - 1) * 0x20 + (uint)in_DX;
    bVar1 = VmaBlockMetadata::IsVirtual(in_RDI);
    if (bVar1) {
      local_4 = iVar2 + 0x20;
    }
    else {
      local_4 = iVar2 + 4;
    }
  }
  return local_4;
}

Assistant:

uint32_t VmaBlockMetadata_TLSF::GetListIndex(uint8_t memoryClass, uint16_t secondIndex) const
{
    if (memoryClass == 0)
        return secondIndex;

    const uint32_t index = static_cast<uint32_t>(memoryClass - 1) * (1 << SECOND_LEVEL_INDEX) + secondIndex;
    if (IsVirtual())
        return index + (1 << SECOND_LEVEL_INDEX);
    else
        return index + 4;
}